

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>::
fastAccessDx(value_type *__return_storage_ptr__,
            FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>
            *this,int i)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  int i_1;
  ulong uVar5;
  value_type vVar6;
  FadUnaryMin<Fad<double>_> local_c8;
  FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
  local_c0;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_> local_b0;
  value_type local_98;
  value_type local_78;
  Fad<double> local_58;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_38;
  
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::fastAccessDx
            (&local_58,&this->right_->fadexpr_,i);
  local_b0.fadexpr_.left_ = (FadExpr<FadUnaryMin<Fad<double>_>_> *)&local_c8;
  dVar1 = (this->left_).constant_;
  local_b0.fadexpr_.right_.defaultVal = 0.0;
  local_c8.expr_ = &local_58;
  local_b0.fadexpr_.right_.constant_ = dVar1;
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_78,&this->right_->fadexpr_);
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_98,&this->right_->fadexpr_);
  local_c0.right_ = &local_38;
  local_c0.left_ = &local_b0;
  __return_storage_ptr__->val_ = (dVar1 * -(local_c8.expr_)->val_) / (local_78.val_ * local_98.val_)
  ;
  if (local_98.dx_.num_elts < local_78.dx_.num_elts) {
    local_98.dx_.num_elts = local_78.dx_.num_elts;
  }
  uVar2 = ((local_c8.expr_)->dx_).num_elts;
  uVar3 = local_98.dx_.num_elts;
  if (local_98.dx_.num_elts < (int)uVar2) {
    uVar3 = uVar2;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  local_38.fadexpr_.left_ = &local_78;
  local_38.fadexpr_.right_ = &local_98;
  if ((int)uVar3 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar3;
    pdVar4 = (double *)operator_new__((ulong)uVar3 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
    __return_storage_ptr__->defaultVal = 0.0;
    uVar5 = 0;
    do {
      vVar6 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
              ::dx(&local_c0,(int)uVar5);
      pdVar4[uVar5] = vVar6;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  Fad<double>::~Fad(&local_98);
  Fad<double>::~Fad(&local_78);
  Fad<double>::~Fad(&local_58);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return (- right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}